

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

Vec_Int_t * Wlc_ReduceMarkedInitVec(Wlc_Ntk_t *p,Vec_Int_t *vInit)

{
  int iVar1;
  int *__src;
  int *piVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *__dest;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar1 = vInit->nSize;
  lVar5 = (long)iVar1;
  pVVar4->nSize = iVar1;
  pVVar4->nCap = iVar1;
  if (lVar5 == 0) {
    __dest = (int *)0x0;
  }
  else {
    __dest = (int *)malloc(lVar5 * 4);
  }
  pVVar4->pArray = __dest;
  __src = vInit->pArray;
  memcpy(__dest,__src,lVar5 * 4);
  if (iVar1 != (p->vCis).nSize - (p->vPis).nSize) {
    __assert_fail("Vec_IntSize(vInit) == Wlc_NtkCiNum(p) - Wlc_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                  ,0x365,"Vec_Int_t *Wlc_ReduceMarkedInitVec(Wlc_Ntk_t *, Vec_Int_t *)");
  }
  lVar5 = (long)(p->vCis).nSize;
  if (lVar5 < 1) {
    uVar3 = 0;
  }
  else {
    piVar2 = (p->vCis).pArray;
    lVar6 = 0;
    uVar3 = 0;
    do {
      iVar7 = piVar2[lVar6];
      if (((long)iVar7 < 1) || (p->nObjsAlloc <= iVar7)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((char)*(ushort *)(p->pObjs + iVar7) < '\0' && (*(ushort *)(p->pObjs + iVar7) & 0x3f) != 1)
      {
        uVar8 = (ulong)(uint)-(p->vPis).nSize + lVar6;
        iVar7 = (int)uVar8;
        if ((iVar7 < 0) || (vInit->nSize <= iVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (((int)uVar3 < 0) || (iVar1 <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar9 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
        __dest[uVar9] = __src[uVar8 & 0xffffffff];
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  if (iVar1 < (int)uVar3) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  pVVar4->nSize = uVar3;
  return pVVar4;
}

Assistant:

Vec_Int_t * Wlc_ReduceMarkedInitVec( Wlc_Ntk_t * p, Vec_Int_t * vInit )
{
    Vec_Int_t * vInitNew = Vec_IntDup( vInit );
    Wlc_Obj_t * pObj; int i, k = 0;
    assert( Vec_IntSize(vInit) == Wlc_NtkCiNum(p) - Wlc_NtkPiNum(p) );
    Wlc_NtkForEachCi( p, pObj, i )
        if ( !Wlc_ObjIsPi(pObj) && pObj->Mark )
            Vec_IntWriteEntry( vInitNew, k++, Vec_IntEntry(vInit, i - Wlc_NtkPiNum(p)) );
    Vec_IntShrink( vInitNew, k );
    return vInitNew;
}